

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O0

X * __thiscall IMLE::predict(IMLE *this,Z *z)

{
  double dVar1;
  Index IVar2;
  Scalar *pSVar3;
  reference pFVar4;
  RowwiseReturnType other;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_00;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *__x;
  reference pMVar5;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_RDI;
  double dVar6;
  X sumInvRxj;
  X sumInvRj;
  int j_1;
  int j;
  Scal sum_p;
  string *in_stack_fffffffffffffd38;
  IMLE *in_stack_fffffffffffffd40;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffffd48;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffd50;
  Index in_stack_fffffffffffffd58;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_01;
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffd60;
  value_type_conflict __x_00;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffffd68;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd70;
  allocator *in_stack_fffffffffffffd90;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_1e0 [216];
  Z *in_stack_fffffffffffffef8;
  LinearExpert *in_stack_ffffffffffffff00;
  int local_6c;
  int local_54;
  allocator local_31;
  string local_30 [48];
  
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::clear((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           *)0x2fb930);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::clear((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           *)0x2fb941);
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x2fb952);
  IVar2 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffd40
                    );
  if (IVar2 == *(int *)in_RDI) {
    for (local_54 = 0; local_54 < *(int *)(in_RDI + 200); local_54 = local_54 + 1) {
      std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
      operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                  *)(in_RDI + 0xb0),(long)local_54);
      LinearExpert::queryZ(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    }
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setConstant
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffd50
               ,(Index)in_stack_fffffffffffffd48,(Scalar *)in_stack_fffffffffffffd40);
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setConstant
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffd50
               ,(Index)in_stack_fffffffffffffd48,(Scalar *)in_stack_fffffffffffffd40);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        in_stack_fffffffffffffd40,(Index)in_stack_fffffffffffffd38);
    *(Scalar *)(in_RDI + 0x1b8) = *pSVar3;
  }
  else {
    in_stack_fffffffffffffd90 = &local_31;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_30,"IMLE::predict: query dimension does not match input dimension!!",
               in_stack_fffffffffffffd90);
    message(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffd50
               ,(Index)in_stack_fffffffffffffd48);
  }
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                      in_stack_fffffffffffffd40,(Index)in_stack_fffffffffffffd38);
  if ((*pSVar3 != 0.0) || (NAN(*pSVar3))) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffd40
               ,(Index)in_stack_fffffffffffffd38);
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
              (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,(Index)in_stack_fffffffffffffd50)
    ;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
              (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,(Index)in_stack_fffffffffffffd50)
    ;
    for (local_6c = 0; local_6c < *(int *)(in_RDI + 200); local_6c = local_6c + 1) {
      pFVar4 = std::
               vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
               operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                           *)(in_RDI + 0xb0),(long)local_6c);
      in_stack_fffffffffffffd68 =
           (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
           LinearExpert::getGamma(&pFVar4->super_LinearExpert);
      pFVar4 = std::
               vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
               operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                           *)(in_RDI + 0xb0),(long)local_6c);
      in_stack_fffffffffffffd70 =
           (vector<int,_std::allocator<int>_> *)LinearExpert::get_p_z(&pFVar4->super_LinearExpert);
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          in_stack_fffffffffffffd40,(Index)in_stack_fffffffffffffd38);
      dVar1 = *pSVar3;
      dVar6 = (double)in_stack_fffffffffffffd68 * (double)in_stack_fffffffffffffd70;
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          in_stack_fffffffffffffd40,(Index)in_stack_fffffffffffffd38);
      *pSVar3 = dVar6 + dVar1;
      pFVar4 = std::
               vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
               operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                           *)(in_RDI + 0xb0),(long)local_6c);
      LinearExpert::getPredXInvVar(&pFVar4->super_LinearExpert);
      pFVar4 = std::
               vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
               operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                           *)(in_RDI + 0xb0),(long)local_6c);
      LinearExpert::get_p_z(&pFVar4->super_LinearExpert);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                 in_stack_fffffffffffffd40,(Index)in_stack_fffffffffffffd38);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
                (in_RDI,(double *)in_stack_fffffffffffffd90);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (in_stack_fffffffffffffd50,(Index)in_stack_fffffffffffffd48);
      Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
                 in_stack_fffffffffffffd40,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                  *)in_stack_fffffffffffffd38);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (in_stack_fffffffffffffd50,(Index)in_stack_fffffffffffffd48);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::
      asDiagonal((MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *
                 )in_stack_fffffffffffffd40);
      pFVar4 = std::
               vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
               operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                           *)(in_RDI + 0xb0),(long)local_6c);
      LinearExpert::getPredX(&pFVar4->super_LinearExpert);
      Eigen::
      DiagonalBase<Eigen::DiagonalWrapper<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>const>>
      ::operator*((DiagonalBase<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                   *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                (in_stack_fffffffffffffd50,(Index)in_stack_fffffffffffffd48);
      Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>::operator=
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)
                 in_stack_fffffffffffffd40,
                 (DenseBase<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>_>
                  *)in_stack_fffffffffffffd38);
    }
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rowwise
              ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffffd38);
    this_01 = local_1e0;
    Eigen::VectorwiseOp<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::sum
              ((VectorwiseOp<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)this_01);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::PartialReduxExpr<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::member_sum<double,double>,1>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffd40,
               (EigenBase<Eigen::PartialReduxExpr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double,_double>,_1>_>
                *)in_stack_fffffffffffffd38);
    other = Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rowwise
                      ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                       in_stack_fffffffffffffd38);
    Eigen::VectorwiseOp<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::sum
              ((VectorwiseOp<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)this_01);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::PartialReduxExpr<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::member_sum<double,double>,1>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffd40,
               (EigenBase<Eigen::PartialReduxExpr<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::internal::member_sum<double,_double>,_1>_>
                *)in_stack_fffffffffffffd38);
    this_00 = in_RDI + 0x1d8;
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    cwiseQuotient<Eigen::Matrix<double,_1,1,0,_1,1>>
              (in_stack_fffffffffffffd68,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)other.m_matrix);
    __x_00 = (value_type_conflict)((ulong)other.m_matrix >> 0x20);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffd40,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)in_stack_fffffffffffffd38);
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::push_back((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 *)this_00,(value_type *)in_stack_fffffffffffffd48);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x2fbfbf);
    __x = in_RDI + 0x1f0;
    Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::cwiseInverse(this_01);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffd40,
               (EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_inverse_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)in_stack_fffffffffffffd38);
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::push_back((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 *)this_00,(value_type *)__x);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x2fc01a);
    in_stack_fffffffffffffd38 = (string *)(in_RDI + 0x208);
    in_stack_fffffffffffffd40 =
         (IMLE *)Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                            in_stack_fffffffffffffd40,(Index)in_stack_fffffffffffffd38);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)this_00,(value_type *)__x);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x2fc082);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x2fc091);
  }
  else {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setConstant
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffd50
               ,(Index)in_stack_fffffffffffffd48,(Scalar *)in_stack_fffffffffffffd40);
    __x_00 = (value_type_conflict)((ulong)in_stack_fffffffffffffd60 >> 0x20);
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
              ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
               in_stack_fffffffffffffd50,(Index)in_stack_fffffffffffffd48,
               (Index)in_stack_fffffffffffffd40);
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setZero
              ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
               in_stack_fffffffffffffd50,(Index)in_stack_fffffffffffffd48,
               (Index)in_stack_fffffffffffffd40);
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::push_back((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 *)in_stack_fffffffffffffd50,(value_type *)in_stack_fffffffffffffd48);
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::push_back((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 *)in_stack_fffffffffffffd50,(value_type *)in_stack_fffffffffffffd48);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd50,
               (value_type *)in_stack_fffffffffffffd48);
  }
  *(int *)(in_RDI + 0x284) = 1;
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x2fc14c);
  std::vector<int,_std::allocator<int>_>::resize
            (in_stack_fffffffffffffd70,(size_type)in_stack_fffffffffffffd68,__x_00);
  *(int *)(in_RDI + 0x280) = 0;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffd40,
             (Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffd38);
  in_RDI[0x288] = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)0x0;
  in_RDI[0x289] = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)0x0;
  pMVar5 = std::
           vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
           ::operator[]((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                         *)(in_RDI + 0x1d8),(long)*(int *)(in_RDI + 0x280));
  return pMVar5;
}

Assistant:

IMLE_CLASS_TEMPLATE
IMLE_TYPENAME IMLE_base::X const &IMLE_base::predict(Z const &z)
{

    // Clear predict data structure
    predictions.clear();
    predictionsVar.clear();
    predictionsWeight.clear();

#ifdef IMLE_NO_TEMPLATES
    // Check dimensions
    if( z.size() != d )
    {
        message("IMLE::predict: query dimension does not match input dimension!!");

        sum_p_z.setZero(1);
    }
    else
#endif
    {
        Scal sum_p = 0.0;
        for(int j = 0; j < M; j++)
            sum_p += experts[j].queryZ(z);
        sum_p_z.setConstant(1, sum_p);
        sumW.setConstant(1, sum_p + pNoiseModelZ);
        sumAll = sumW(0);
    }

    if(sum_p_z(0) == 0.0)  // This happens when a prediction is sought too far from the current mixture
    {
        varPhiAuxj.setConstant(M,pNoiseModelZ);
        fInvRj.setZero(D,M);
        invRxj.setZero(D,M);

        predictions.push_back(zeroX);
        predictionsVar.push_back(infinityX);
        predictionsWeight.push_back(0.0);
    }
    else
    {
        varPhiAuxj.resize(M);
        fInvRj.resize(D,M);
        invRxj.resize(D,M);
        for(int j = 0; j < M; j++)
        {
            varPhiAuxj(j) = experts[j].getGamma() * experts[j].get_p_z() + sumW(0);
            fInvRj.col(j) = experts[j].getPredXInvVar() * (experts[j].get_p_z() / varPhiAuxj(j));
            invRxj.col(j) = fInvRj.col(j).asDiagonal() * experts[j].getPredX();
        }

        // Update storage results
        X sumInvRj = fInvRj.rowwise().sum();
        X sumInvRxj = invRxj.rowwise().sum();

        predictions.push_back( sumInvRxj.cwiseQuotient(sumInvRj) );
        predictionsVar.push_back( sumInvRj.cwiseInverse() );
        predictionsWeight.push_back( sum_p_z(0) / sumAll );
    }

    nSolFound = 1;
    sNearest.clear();
    sNearest.resize(M,0);

    solIdx = 0;

    zQuery = z;
    hasPredJacobian = false;
    hasPredErrorReductionDrvt = false;

    return predictions[solIdx];
}